

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRendererSDL.cpp
# Opt level: O2

string * __thiscall
ImGuiRendererSDL::loadTextureFromFile
          (string *__return_storage_ptr__,ImGuiRendererSDL *this,path *filepath,GLuint *out_texture,
          int *out_width,int *out_height)

{
  int __val;
  GLenum __val_00;
  stbi_uc *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long in_FS_OFFSET;
  int glMaxTextureSize;
  string *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  GLsizei local_114;
  int image_height;
  int image_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  GLuint image_texture;
  string local_88;
  vector<char,_std::allocator<char>_> buf;
  string error_msg;
  
  image_width = 0;
  image_height = 0;
  error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
  error_msg._M_string_length = 0;
  error_msg.field_2._M_local_buf[0] = '\0';
  file_as_buffer(&buf,filepath,&error_msg);
  if ((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       == buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) || (error_msg._M_string_length != 0)) {
    std::filesystem::__cxx11::path::string(&local_108,filepath);
    std::operator+(&local_138,&local_108,": ");
    std::operator+(__return_storage_ptr__,&local_138,&error_msg);
    std::__cxx11::string::~string((string *)&local_138);
    pbVar1 = &local_108;
  }
  else {
    local_140 = __return_storage_ptr__;
    __ptr = stbi_load_from_memory
                      ((stbi_uc *)
                       buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                       (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,&image_width,&image_height,(int *)0x0,4
                      );
    if (__ptr == (stbi_uc *)0x0) {
      std::filesystem::__cxx11::path::string(&local_e8,filepath);
      std::operator+(&local_108,"Could not load image from ",&local_e8);
      __return_storage_ptr__ = local_140;
      std::operator+(&local_138,&local_108,": ");
      std::operator+(__return_storage_ptr__,&local_138,*(char **)(in_FS_OFFSET + -0x10));
      pbVar1 = &local_138;
LAB_0013adee:
      std::__cxx11::string::~string((string *)pbVar1);
      std::__cxx11::string::~string((string *)&local_108);
      pbVar1 = &local_e8;
    }
    else {
      (*glad_glGetIntegerv)(0xd33,&glMaxTextureSize);
      __val = image_width;
      if (glMaxTextureSize < image_width) {
        std::filesystem::__cxx11::path::string(&local_c8,filepath);
        std::operator+(&local_e8,&local_c8,": width of ");
        __return_storage_ptr__ = local_140;
        std::__cxx11::to_string((string *)&image_texture,__val);
        std::operator+(&local_108,&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &image_texture);
        std::operator+(&local_138,&local_108,"px is too large for this GPU. Maximum allowed: ");
        std::__cxx11::to_string(&local_88,glMaxTextureSize);
        std::operator+(__return_storage_ptr__,&local_138,&local_88);
      }
      else {
        if (image_height <= glMaxTextureSize) {
          local_114 = image_height;
          (*glad_glGenTextures)(1,&image_texture);
          (*glad_glBindTexture)(0xde1,image_texture);
          (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
          (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
          (*glad_glPixelStorei)(0xcf2,0);
          (*glad_glTexImage2D)(0xde1,0,0x1908,__val,local_114,0,0x1908,0x1401,__ptr);
          __val_00 = (*glad_glGetError)();
          if (__val_00 == 0) {
            free(__ptr);
            *out_texture = image_texture;
            *out_width = __val;
            *out_height = local_114;
            (local_140->_M_dataplus)._M_p = (pointer)&local_140->field_2;
            local_140->_M_string_length = 0;
            (local_140->field_2)._M_local_buf[0] = '\0';
            __return_storage_ptr__ = local_140;
            goto LAB_0013aee8;
          }
          if (__val_00 == 0x505) {
            std::filesystem::__cxx11::path::string(&local_138,filepath);
            __return_storage_ptr__ = local_140;
            std::operator+(local_140,&local_138,": image too large to fit in the GPU memory.");
            pbVar1 = &local_138;
            goto LAB_0013aee3;
          }
          std::filesystem::__cxx11::path::string(&local_e8,filepath);
          __return_storage_ptr__ = local_140;
          std::operator+(&local_108,&local_e8,": error ");
          std::__cxx11::to_string(&local_c8,__val_00);
          std::operator+(&local_138,&local_108,&local_c8);
          std::operator+(__return_storage_ptr__,&local_138,
                         " when loading the image into GPU memory.");
          std::__cxx11::string::~string((string *)&local_138);
          pbVar1 = &local_c8;
          goto LAB_0013adee;
        }
        std::filesystem::__cxx11::path::string(&local_c8,filepath);
        std::operator+(&local_e8,&local_c8,": height of ");
        __return_storage_ptr__ = local_140;
        std::__cxx11::to_string((string *)&image_texture,__val);
        std::operator+(&local_108,&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &image_texture);
        std::operator+(&local_138,&local_108,"px is too large for this GPU. Maximum allowed: ");
        std::__cxx11::to_string(&local_88,glMaxTextureSize);
        std::operator+(__return_storage_ptr__,&local_138,&local_88);
      }
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&image_texture);
      std::__cxx11::string::~string((string *)&local_e8);
      pbVar1 = &local_c8;
    }
  }
LAB_0013aee3:
  std::__cxx11::string::~string((string *)pbVar1);
LAB_0013aee8:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&error_msg);
  return __return_storage_ptr__;
}

Assistant:

std::string ImGuiRendererSDL::loadTextureFromFile(const filesystem::path &filepath, GLuint* out_texture, int* out_width, int* out_height)
{
	// Load from file
	int image_width = 0;
	int image_height = 0;

	std::string error_msg;
	auto buf = file_as_buffer(filepath, error_msg);
	if (buf.empty() || !error_msg.empty()) {
		return filepath.string() + ": " + error_msg;
	}
	unsigned char* image_data = stbi_load_from_memory(reinterpret_cast<unsigned char*>(buf.data()), buf.size(), &image_width, &image_height, NULL, 4);

	if (image_data == nullptr) {
		return "Could not load image from " + filepath.string() + ": " + stbi_failure_reason();
	}

	int glMaxTextureSize;
	glGetIntegerv(GL_MAX_TEXTURE_SIZE, &glMaxTextureSize);
	if (image_width > glMaxTextureSize) {
		return filepath.string() + ": width of " + std::to_string(image_width) + "px is too large for this GPU. Maximum allowed: " + std::to_string(glMaxTextureSize);
	}

	if (image_height > glMaxTextureSize) {
		return filepath.string() + ": height of " + std::to_string(image_width) + "px is too large for this GPU. Maximum allowed: " + std::to_string(glMaxTextureSize);
	}

	// Create a OpenGL texture identifier
	GLuint image_texture;
	glGenTextures(1, &image_texture);
	glBindTexture(GL_TEXTURE_2D, image_texture);

	// Setup filtering parameters for display
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// Upload pixels into texture
	glPixelStorei(GL_UNPACK_ROW_LENGTH, 0);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, image_width, image_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, image_data);

	GLenum code = glGetError();
	if (code == GL_OUT_OF_MEMORY) {
		return filepath.string() + ": image too large to fit in the GPU memory.";
	}
	if (code != GL_NO_ERROR) {
		return filepath.string() + ": error " + std::to_string(code) + " when loading the image into GPU memory.";
	}

	stbi_image_free(image_data);

	*out_texture = image_texture;
	*out_width = image_width;
	*out_height = image_height;

	return {};
}